

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

void __thiscall iDynTree::optimalcontrol::MeshPointOrigin::MeshPointOrigin(MeshPointOrigin *this)

{
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"ERROR","");
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_description,"A meshPointOrigin not initialized","");
  this->m_priority = -1;
  return;
}

Assistant:

MeshPointOrigin()
            :m_name("ERROR")
            ,m_description("A meshPointOrigin not initialized")
            ,m_priority(-1)
            {}